

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArraySet.h
# Opt level: O2

bool __thiscall ArraySet::Contains(ArraySet *this,int x)

{
  int iVar1;
  pointer piVar2;
  
  if (-1 < x) {
    piVar2 = (this->m_Lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(uint)x <
        (ulong)((long)(this->m_Lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2)) {
      iVar1 = piVar2[(uint)x];
      return iVar1 <= this->m_iEnd && this->m_iBegin <= iVar1;
    }
  }
  return false;
}

Assistant:

bool Contains(int const x) const {
        if (x < 0 || x >= m_Lookup.size()) return false;
        int const locationX(m_Lookup[x]);
        return locationX >= m_iBegin && locationX <= m_iEnd;
    }